

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O0

PacketProtocolLayer *
ssh1_connection_new(Ssh *ssh,Conf *conf,bufchain *user_input,ConnectionLayer **cl_out)

{
  void *__s;
  Conf *pCVar1;
  tree234 *ptVar2;
  LogContext *pLVar3;
  PortFwdManager *pPVar4;
  ssh1_connection_state *s;
  ConnectionLayer **cl_out_local;
  bufchain *user_input_local;
  Conf *conf_local;
  Ssh *ssh_local;
  
  __s = safemalloc(1,0x158,0);
  memset(__s,0,0x158);
  *(PacketProtocolLayerVtable **)((long)__s + 0xf0) = &ssh1_connection_vtable;
  pCVar1 = conf_copy(conf);
  *(Conf **)((long)__s + 8) = pCVar1;
  ptVar2 = newtree234(ssh1_channelcmp);
  *(tree234 **)((long)__s + 0x18) = ptVar2;
  ptVar2 = newtree234(x11_authcmp);
  *(tree234 **)((long)__s + 0x78) = ptVar2;
  *(bufchain **)((long)__s + 0x58) = user_input;
  *(ConnectionLayerVtable **)((long)__s + 0xe8) = &ssh1_connlayer_vtable;
  pLVar3 = ssh_get_logctx(ssh);
  *(LogContext **)((long)__s + 0xe0) = pLVar3;
  pPVar4 = portfwdmgr_new((ConnectionLayer *)((long)__s + 0xe0));
  *(PortFwdManager **)((long)__s + 0x88) = pPVar4;
  ptVar2 = newtree234(ssh1_rportfwd_cmp);
  *(tree234 **)((long)__s + 0x80) = ptVar2;
  *cl_out = (ConnectionLayer *)((long)__s + 0xe0);
  return (PacketProtocolLayer *)((long)__s + 0xf0);
}

Assistant:

PacketProtocolLayer *ssh1_connection_new(
    Ssh *ssh, Conf *conf, bufchain *user_input, ConnectionLayer **cl_out)
{
    struct ssh1_connection_state *s = snew(struct ssh1_connection_state);
    memset(s, 0, sizeof(*s));
    s->ppl.vt = &ssh1_connection_vtable;

    s->conf = conf_copy(conf);

    s->channels = newtree234(ssh1_channelcmp);

    s->x11authtree = newtree234(x11_authcmp);

    s->user_input = user_input;

    /* Need to get the log context for s->cl now, because we won't be
     * helpfully notified when a copy is written into s->ppl by our
     * owner. */
    s->cl.vt = &ssh1_connlayer_vtable;
    s->cl.logctx = ssh_get_logctx(ssh);

    s->portfwdmgr = portfwdmgr_new(&s->cl);
    s->rportfwds = newtree234(ssh1_rportfwd_cmp);

    *cl_out = &s->cl;
    return &s->ppl;
}